

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteString.cpp
# Opt level: O2

void __thiscall ByteString::ByteString(ByteString *this,uchar *bytes,size_t bytesLen)

{
  this->_vptr_ByteString = (_func_int **)&PTR__ByteString_0014ed50;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>._M_impl.
  super__Tp_alloc_type._vptr_SecureAllocator = (_func_int **)&PTR__SecureAllocator_0014ed88;
  std::vector<unsigned_char,_SecureAllocator<unsigned_char>_>::resize(&this->byteString,bytesLen);
  if (bytesLen != 0) {
    memcpy((this->byteString).super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start,bytes,bytesLen);
    return;
  }
  return;
}

Assistant:

ByteString::ByteString(const unsigned char* bytes, const size_t bytesLen)
{
	byteString.resize(bytesLen);

	if (bytesLen > 0)
		memcpy(&byteString[0], bytes, bytesLen);
}